

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::RoundScalar(float value,int decimal_precision)

{
  float __x;
  float fVar1;
  float local_24;
  float local_20;
  float remainder;
  bool negative;
  float min_step;
  int decimal_precision_local;
  float value_local;
  
  if ((decimal_precision < 0) || (9 < decimal_precision)) {
    local_20 = powf(10.0,(float)-decimal_precision);
  }
  else {
    local_20 = RoundScalar::min_steps[decimal_precision];
  }
  __x = ABS(value);
  fVar1 = fmodf(__x,local_20);
  if (local_20 * 0.5 < fVar1) {
    min_step = (local_20 - fVar1) + __x;
  }
  else {
    min_step = __x - fVar1;
  }
  if (0.0 <= value) {
    local_24 = min_step;
  }
  else {
    local_24 = -min_step;
  }
  return local_24;
}

Assistant:

float ImGui::RoundScalar(float value, int decimal_precision)
{
    // Round past decimal precision
    // So when our value is 1.99999 with a precision of 0.001 we'll end up rounding to 2.0
    // FIXME: Investigate better rounding methods
    static const float min_steps[10] = { 1.0f, 0.1f, 0.01f, 0.001f, 0.0001f, 0.00001f, 0.000001f, 0.0000001f, 0.00000001f, 0.000000001f };
    float min_step = (decimal_precision >= 0 && decimal_precision < 10) ? min_steps[decimal_precision] : powf(10.0f, (float)-decimal_precision);
    bool negative = value < 0.0f;
    value = fabsf(value);
    float remainder = fmodf(value, min_step);
    if (remainder <= min_step*0.5f)
        value -= remainder;
    else
        value += (min_step - remainder);
    return negative ? -value : value;
}